

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecmanager.cxx
# Opt level: O2

string * __thiscall
vigra::CodecManager::getFileTypeByMagicString
          (string *__return_storage_ptr__,CodecManager *this,string *filename)

{
  bool bVar1;
  pointer ppVar2;
  allocator local_24d;
  char fmagic [4];
  string msg;
  ifstream stream;
  int aiStack_208 [122];
  
  std::ifstream::ifstream(&stream,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_208 + *(long *)(_stream + -0x18)) != 0) {
    std::__cxx11::string::string((string *)&msg,"Unable to open file \'",&local_24d);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::append((char *)&msg);
    throw_precondition_error
              (false,msg._M_dataplus._M_p,
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/codecmanager.cxx"
               ,0xcb);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::istream::read((char *)&stream,(long)fmagic);
  std::ifstream::close();
  ppVar2 = (this->magicStrings).
           super__Vector_base<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if ((this->magicStrings).
        super__Vector_base<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish <= ppVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0012c1bf:
      std::ifstream::~ifstream(&stream);
      return __return_storage_ptr__;
    }
    bVar1 = std::__equal<true>::equal<char>
                      ((ppVar2->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (ppVar2->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,fmagic);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
      goto LAB_0012c1bf;
    }
    ppVar2 = ppVar2 + 1;
  } while( true );
}

Assistant:

std::string
    CodecManager::getFileTypeByMagicString( const std::string & filename )
        const
    {
        // support for reading the magic string from stdin has been dropped
        // it was not guaranteed to work by the Standard

        // get the magic string
        const unsigned int magiclen = 4;
        char fmagic[magiclen];
#ifdef VIGRA_NEED_BIN_STREAMS
        std::ifstream stream(filename.c_str(), std::ios::binary);
#else
        std::ifstream stream(filename.c_str());
#endif
        if(!stream.good())
        {
            std::string msg("Unable to open file '");
            msg += filename;
            msg += "'.";
            vigra_precondition(0, msg.c_str());
        }
        stream.read( fmagic, magiclen );
        stream.close();

        // compare with the known magic strings
        typedef std::vector< std::pair< std::vector<char>, std::string > >
            magic_type;
        for( magic_type::const_iterator iter = magicStrings.begin();
             iter < magicStrings.end(); ++iter ) {
            const std::vector<char> & magic = iter->first;
            if ( std::equal( magic.begin(), magic.end(), fmagic ) )
                return iter->second;
        }

        // did not find a matching string
        return std::string();
    }